

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall
glu::TextureCube::TextureCube
          (TextureCube *this,RenderContext *context,ContextInfo *contextInfo,int numLevels,
          CompressedTexture *levels,TexDecompressionParams *decompressionParams)

{
  CompressedTexFormat CVar1;
  deUint32 dVar2;
  int iVar3;
  deBool dVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  InternalError *this_00;
  NotSupportedError *this_01;
  exception *anon_var_0;
  Functions *gl;
  TexDecompressionParams *local_38;
  TexDecompressionParams *decompressionParams_local;
  CompressedTexture *levels_local;
  ContextInfo *pCStack_20;
  int numLevels_local;
  ContextInfo *contextInfo_local;
  RenderContext *context_local;
  TextureCube *this_local;
  
  this->m_context = context;
  this->m_isCompressed = true;
  local_38 = decompressionParams;
  decompressionParams_local = (TexDecompressionParams *)levels;
  levels_local._4_4_ = numLevels;
  pCStack_20 = contextInfo;
  contextInfo_local = (ContextInfo *)context;
  context_local = (RenderContext *)this;
  CVar1 = tcu::CompressedTexture::getFormat(levels);
  dVar2 = getGLFormat(CVar1);
  this->m_format = dVar2;
  CVar1 = tcu::CompressedTexture::getFormat((CompressedTexture *)decompressionParams_local);
  gl = (Functions *)tcu::getUncompressedFormat(CVar1);
  iVar3 = tcu::CompressedTexture::getWidth((CompressedTexture *)decompressionParams_local);
  tcu::TextureCube::TextureCube(&this->m_refTexture,(TextureFormat *)&gl,iVar3);
  this->m_glTexture = 0;
  iVar3 = (*this->m_context->_vptr_RenderContext[3])();
  while( true ) {
    dVar4 = ::deGetFalse();
    if (dVar4 != 0) break;
    iVar5 = tcu::CompressedTexture::getWidth((CompressedTexture *)decompressionParams_local);
    iVar6 = tcu::CompressedTexture::getHeight((CompressedTexture *)decompressionParams_local);
    if (iVar5 != iVar6) break;
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      uVar7 = (*pCStack_20->_vptr_ContextInfo[10])(pCStack_20,(ulong)this->m_format);
      if ((uVar7 & 1) == 0) {
        this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_01,"Compressed texture format not supported","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                   ,0x14e);
        __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      (**(code **)(CONCAT44(extraout_var,iVar3) + 0x6f8))(1,&this->m_glTexture);
      dVar2 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
      checkError(dVar2,"glGenTextures() failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x151);
      loadCompressed(this,levels_local._4_4_,(CompressedTexture *)decompressionParams_local,local_38
                    );
      return;
    }
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,(char *)0x0,"levels[0].getWidth() == levels[0].getHeight()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x14b);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

TextureCube::TextureCube (const RenderContext& context, const ContextInfo& contextInfo, int numLevels, const tcu::CompressedTexture* levels, const tcu::TexDecompressionParams& decompressionParams)
	: m_context			(context)
	, m_isCompressed	(true)
	, m_format			(getGLFormat(levels[0].getFormat()))
	, m_refTexture		(getUncompressedFormat(levels[0].getFormat()), levels[0].getWidth())
	, m_glTexture		(0)
{
	const glw::Functions& gl = m_context.getFunctions();

	TCU_CHECK_INTERNAL(levels[0].getWidth() == levels[0].getHeight());

	if (!contextInfo.isCompressedTextureFormatSupported(m_format))
		throw tcu::NotSupportedError("Compressed texture format not supported", "", __FILE__, __LINE__);

	gl.genTextures(1, &m_glTexture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");

	try
	{
		loadCompressed(numLevels, levels, decompressionParams);
	}
	catch (const std::exception&)
	{
		gl.deleteTextures(1, &m_glTexture);
		throw;
	}
}